

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  MethodDescriptorProto *this_00;
  ServiceOptions *this_01;
  void *pvVar2;
  bool bVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->method_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar9 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (MethodDescriptorProto *)
                ((this->method_).super_RepeatedPtrFieldBase.rep_)->elements[iVar9];
      *target = '\x12';
      uVar8 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar8 < 0x80) {
        target[1] = (byte)uVar8;
        puVar4 = target + 2;
      }
      else {
        target[1] = (byte)uVar8 | 0x80;
        if (uVar8 < 0x4000) {
          target[2] = (uint8)(uVar8 >> 7);
          puVar4 = target + 3;
        }
        else {
          puVar4 = target + 3;
          uVar8 = uVar8 >> 7;
          do {
            puVar5 = puVar4;
            puVar5[-1] = (byte)uVar8 | 0x80;
            uVar6 = uVar8 >> 7;
            puVar4 = puVar5 + 1;
            bVar3 = 0x3fff < uVar8;
            uVar8 = uVar6;
          } while (bVar3);
          *puVar5 = (uint8)uVar6;
        }
      }
      target = MethodDescriptorProto::InternalSerializeWithCachedSizesToArray(this_00,puVar4,stream)
      ;
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar1);
  }
  if ((uVar7 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->options_;
    *target = '\x1a';
    uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar7 < 0x80) {
      target[1] = (byte)uVar7;
      puVar4 = target + 2;
    }
    else {
      target[1] = (byte)uVar7 | 0x80;
      if (uVar7 < 0x4000) {
        target[2] = (uint8)(uVar7 >> 7);
        puVar4 = target + 3;
      }
      else {
        puVar4 = target + 3;
        uVar7 = uVar7 >> 7;
        do {
          puVar5 = puVar4;
          puVar5[-1] = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          puVar4 = puVar5 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar3);
        *puVar5 = (uint8)uVar8;
      }
    }
    target = ServiceOptions::InternalSerializeWithCachedSizesToArray(this_01,puVar4,stream);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* ServiceDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.ServiceDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_method_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_method(i), target, stream);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceDescriptorProto)
  return target;
}